

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_info.hpp
# Opt level: O3

void __thiscall
duckdb::CreateInfo::CreateInfo(CreateInfo *this,CatalogType type,string *schema,string *catalog_p)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  LogicalType local_40;
  
  (this->super_ParseInfo).info_type = CREATE_INFO;
  (this->super_ParseInfo)._vptr_ParseInfo = (_func_int **)&PTR__CreateInfo_024460e0;
  (this->super_ParseInfo).field_0x9 = type;
  paVar1 = &(this->catalog).field_2;
  (this->catalog)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (catalog_p->_M_dataplus)._M_p;
  paVar2 = &catalog_p->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&catalog_p->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->catalog).field_2 + 8) = uVar4;
  }
  else {
    (this->catalog)._M_dataplus._M_p = pcVar3;
    (this->catalog).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->catalog)._M_string_length = catalog_p->_M_string_length;
  (catalog_p->_M_dataplus)._M_p = (pointer)paVar2;
  catalog_p->_M_string_length = 0;
  (catalog_p->field_2)._M_local_buf[0] = '\0';
  paVar1 = &(this->schema).field_2;
  (this->schema)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (schema->_M_dataplus)._M_p;
  paVar2 = &schema->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&schema->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->schema).field_2 + 8) = uVar4;
  }
  else {
    (this->schema)._M_dataplus._M_p = pcVar3;
    (this->schema).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->schema)._M_string_length = schema->_M_string_length;
  (schema->_M_dataplus)._M_p = (pointer)paVar2;
  schema->_M_string_length = 0;
  (schema->field_2)._M_local_buf[0] = '\0';
  this->on_conflict = ERROR_ON_CONFLICT;
  this->temporary = false;
  this->internal = false;
  (this->sql)._M_dataplus._M_p = (pointer)&(this->sql).field_2;
  (this->sql)._M_string_length = 0;
  (this->sql).field_2._M_local_buf[0] = '\0';
  (this->dependencies).set._M_h._M_buckets = &(this->dependencies).set._M_h._M_single_bucket;
  (this->dependencies).set._M_h._M_bucket_count = 1;
  (this->dependencies).set._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->dependencies).set._M_h._M_element_count = 0;
  (this->dependencies).set._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->dependencies).set._M_h._M_rehash_policy._M_next_resize = 0;
  (this->dependencies).set._M_h._M_single_bucket = (__node_base_ptr)0x0;
  LogicalType::LogicalType(&local_40,SQLNULL);
  Value::Value(&this->comment,&local_40);
  LogicalType::~LogicalType(&local_40);
  (this->tags)._M_h._M_buckets = &(this->tags)._M_h._M_single_bucket;
  (this->tags)._M_h._M_bucket_count = 1;
  (this->tags)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->tags)._M_h._M_element_count = 0;
  (this->tags)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->tags)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->tags)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

explicit CreateInfo(CatalogType type, string schema = DEFAULT_SCHEMA, string catalog_p = INVALID_CATALOG)
	    : ParseInfo(TYPE), type(type), catalog(std::move(catalog_p)), schema(std::move(schema)),
	      on_conflict(OnCreateConflict::ERROR_ON_CONFLICT), temporary(false), internal(false) {
	}